

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O1

void __thiscall
jbcoin::STObject::setFieldUsingAssignment<jbcoin::STArray>
          (STObject *this,SField *field,STArray *value)

{
  int iVar1;
  STBase *pSVar2;
  
  pSVar2 = getPField(this,field,true);
  if (pSVar2 == (STBase *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar1 = (*pSVar2->_vptr_STBase[4])(pSVar2);
  if (iVar1 == 0) {
    pSVar2 = makeFieldPresent(this,field);
  }
  if ((pSVar2 == (STBase *)0x0) || (pSVar2->_vptr_STBase != (_func_int **)&PTR__STArray_002d6ed8)) {
    pSVar2 = (STBase *)0x0;
  }
  if (pSVar2 != (STBase *)0x0) {
    if (pSVar2->fName->fieldCode < 1) {
      pSVar2->fName = (value->super_STBase).fName;
    }
    std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>::operator=
              ((vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_> *)(pSVar2 + 1),
               &value->v_);
    return;
  }
  Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
}

Assistant:

void setFieldUsingAssignment (SField const& field, T const& value)
    {
        STBase* rf = getPField (field, true);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        if (rf->getSType () == STI_NOTPRESENT)
            rf = makeFieldPresent (field);

        T* cf = dynamic_cast<T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        (*cf) = value;
    }